

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSweep.c
# Opt level: O2

Gia_Man_t * Cec_ManFraSpecReduction(Cec_ManFra_t *p)

{
  size_t __size;
  Gia_Rpr_t GVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Gia_Man_t *p_00;
  char *pcVar10;
  undefined4 *__s;
  void *__ptr;
  Gia_Obj_t *pGVar11;
  ulong uVar12;
  Gia_Obj_t *pGVar13;
  Gia_Man_t *pGVar14;
  Cec_ParFra_t *pCVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  
  Gia_ManSetPhase(p->pAig);
  p->vXorNodes->nSize = 0;
  if (p->pPars->nLevelMax != 0) {
    Gia_ManLevelNum(p->pAig);
  }
  p_00 = Gia_ManStart(p->pAig->nObjs);
  pcVar10 = Abc_UtilStrsav(p->pAig->pName);
  p_00->pName = pcVar10;
  pcVar10 = Abc_UtilStrsav(p->pAig->pName);
  p_00->pSpec = pcVar10;
  Gia_ManHashAlloc(p_00);
  pGVar14 = p->pAig;
  iVar3 = pGVar14->nObjs;
  __size = (long)iVar3 * 4;
  __s = (undefined4 *)malloc(__size);
  memset(__s,0xff,__size);
  __ptr = calloc((long)iVar3,4);
  *__s = 0;
  lVar20 = 0x100000000;
  for (uVar19 = 1; (long)uVar19 < (long)iVar3; uVar19 = uVar19 + 1) {
    iVar3 = (int)uVar19;
    pGVar11 = Gia_ManObj(pGVar14,iVar3);
    if (pGVar11 == (Gia_Obj_t *)0x0) break;
    uVar17 = (uint)*(undefined8 *)pGVar11;
    if ((uVar17 & 0x9fffffff) == 0x9fffffff) {
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar12 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pVVar2 = p_00->vCis;
      iVar3 = Gia_ObjId(p_00,pGVar11);
      Vec_IntPush(pVVar2,iVar3);
      iVar3 = Gia_ObjId(p_00,pGVar11);
      __s[uVar19] = iVar3 * 2;
    }
    else if (((-1 < (int)uVar17 || (~uVar17 & 0x1fffffff) == 0) &&
             (iVar4 = *(int *)((long)__s +
                              ((long)((ulong)(uVar17 & 0x1fffffff) * -0x100000000 + lVar20) >> 0x1e)
                              ), iVar4 != -1)) &&
            (*(int *)((long)__s +
                     ((long)((ulong)((uint)((ulong)*(undefined8 *)pGVar11 >> 0x20) & 0x1fffffff) *
                             -0x100000000 + lVar20) >> 0x1e)) != -1)) {
      iVar4 = Abc_LitNotCond(iVar4,uVar17 >> 0x1d & 1);
      iVar5 = Abc_LitNotCond(*(int *)((long)__s +
                                     ((long)((*(ulong *)pGVar11 >> 0x20 & 0x1fffffff) * -0x100000000
                                            + lVar20) >> 0x1e)),
                             (uint)(*(ulong *)pGVar11 >> 0x3d) & 1);
      iVar6 = Gia_ManHashAnd(p_00,iVar4,iVar5);
      __s[uVar19] = iVar6;
      iVar4 = *(int *)((long)__ptr +
                      ((long)((*(ulong *)pGVar11 & 0x1fffffff) * -0x100000000 + lVar20) >> 0x1e));
      iVar5 = *(int *)((long)__ptr +
                      ((long)((*(ulong *)pGVar11 >> 0x20 & 0x1fffffff) * -0x100000000 + lVar20) >>
                      0x1e));
      if (iVar5 < iVar4) {
        iVar5 = iVar4;
      }
      *(int *)((long)__ptr + uVar19 * 4) = iVar5;
      GVar1 = p->pAig->pReprs[uVar19];
      uVar12 = (ulong)(uint)GVar1 & 0xfffffff;
      if ((GVar1._3_1_ >> 5 & 1) == 0 && uVar12 != 0xfffffff) {
        if (uVar19 <= uVar12) {
          __assert_fail("Gia_ObjRepr(p->pAig, i) < i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                        ,0x50,"Gia_Man_t *Cec_ManFraSpecReduction(Cec_ManFra_t *)");
        }
        iVar4 = __s[uVar12];
        if (iVar4 != -1) {
          iVar7 = Abc_LitRegular(iVar6);
          iVar8 = Abc_LitRegular(iVar4);
          if (iVar7 != iVar8) {
            pCVar15 = p->pPars;
            if (pCVar15->nLevelMax == 0) {
LAB_00529a05:
              if (pCVar15->fDualOut == 0) {
                pGVar14 = p->pAig;
                uVar17 = (uint)pGVar14->pReprs[uVar19] & 0xfffffff;
LAB_00529a58:
                pGVar13 = Gia_ManObj(pGVar14,uVar17);
                iVar4 = Abc_LitNotCond(iVar4,(uint)pGVar11 & 1 ^
                                             (uint)((ulong)*(undefined8 *)
                                                            ((ulong)pGVar11 & 0xfffffffffffffffe) >>
                                                   0x3f) ^ (uint)pGVar13 & 1 ^
                                             (uint)((ulong)*(undefined8 *)
                                                            ((ulong)pGVar13 & 0xfffffffffffffffe) >>
                                                   0x3f));
                __s[uVar19] = iVar4;
                if ((p->pAig->pReprs[uVar19].field_0x3 & 0x10) == 0) {
                  uVar17 = Gia_ManHashXor(p_00,iVar6,iVar4);
                  if (((int)uVar17 < 0) || (iVar4 = Abc_Lit2Var(uVar17), p_00->nObjs <= iVar4)) {
                    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                  ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
                  }
                  iVar4 = Abc_Lit2Var(uVar17);
                  pGVar11 = Gia_ManObj(p_00,iVar4);
                  if ((~*(uint *)pGVar11 & 0x1fffffff) != 0 && (int)*(uint *)pGVar11 < 0) {
                    __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                  ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
                  }
                  pGVar11 = Gia_ManAppendObj(p_00);
                  *(ulong *)pGVar11 = *(ulong *)pGVar11 | 0x80000000;
                  iVar4 = Gia_ObjId(p_00,pGVar11);
                  iVar6 = Abc_Lit2Var(uVar17);
                  uVar16 = (ulong)(iVar4 - iVar6 & 0x1fffffff);
                  uVar12 = *(ulong *)pGVar11;
                  uVar18 = (ulong)((uVar17 & 1) << 0x1d);
                  *(ulong *)pGVar11 = uVar18 | uVar12 & 0xffffffffc0000000 | uVar16;
                  *(ulong *)pGVar11 =
                       uVar18 | uVar12 & 0xe0000000c0000000 | uVar16 |
                       (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
                  pVVar2 = p_00->vCos;
                  iVar4 = Gia_ObjId(p_00,pGVar11);
                  Vec_IntPush(pVVar2,iVar4);
                  if (p_00->pFanData != (int *)0x0) {
                    Gia_ObjAddFanout(p_00,pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 &
                                                            0x1fffffff),pGVar11);
                  }
                  Gia_ObjId(p_00,pGVar11);
                  Vec_IntPush(p->vXorNodes,(uint)p->pAig->pReprs[uVar19] & 0xfffffff);
                  Vec_IntPush(p->vXorNodes,iVar3);
                  iVar3 = *(int *)((long)__ptr +
                                  (ulong)((uint)p->pAig->pReprs[uVar19] & 0xfffffff) * 4);
                  if (iVar3 < iVar5) {
                    iVar3 = iVar5;
                  }
                  *(int *)((long)__ptr + uVar19 * 4) = iVar3 + 1;
                  iVar4 = p->pPars->nDepthMax;
                  if ((iVar4 != 0) && (iVar4 <= iVar3 + 1)) {
                    __s[uVar19] = 0xffffffff;
                  }
                }
              }
              else {
                pGVar14 = p->pAig;
                GVar1 = pGVar14->pReprs[uVar19];
                uVar17 = (uint)GVar1 & 0xfffffff;
                uVar9 = (uint)GVar1 ^ (uint)pGVar14->pReprs[uVar17];
                if (pCVar15->fColorDiff == 0) {
                  if (0x3fffffff < uVar9) goto LAB_00529a58;
                }
                else if (0xbfffffff < uVar9) goto LAB_00529a58;
              }
            }
            else {
              iVar7 = Gia_ObjLevelId(p->pAig,iVar3);
              if (iVar7 <= p->pPars->nLevelMax) {
                pGVar14 = p->pAig;
                iVar7 = Abc_Lit2Var(iVar4);
                iVar7 = Gia_ObjLevelId(pGVar14,iVar7);
                pCVar15 = p->pPars;
                if (iVar7 <= pCVar15->nLevelMax) goto LAB_00529a05;
              }
            }
          }
        }
      }
    }
    pGVar14 = p->pAig;
    iVar3 = pGVar14->nObjs;
    lVar20 = lVar20 + 0x100000000;
  }
  free(__s);
  free(__ptr);
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,0);
  pGVar14 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar14;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs limited speculative reduction.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Cec_ManFraSpecReduction( Cec_ManFra_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr = NULL;
    int iRes0, iRes1, iRepr, iNode, iMiter;
    int i, fCompl, * piCopies, * pDepths;
    Gia_ManSetPhase( p->pAig );
    Vec_IntClear( p->vXorNodes );
    if ( p->pPars->nLevelMax )
        Gia_ManLevelNum( p->pAig );
    pNew = Gia_ManStart( Gia_ManObjNum(p->pAig) );
    pNew->pName = Abc_UtilStrsav( p->pAig->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pAig->pName );
    Gia_ManHashAlloc( pNew );
    piCopies = ABC_FALLOC( int, Gia_ManObjNum(p->pAig) );
    pDepths  = ABC_CALLOC( int, Gia_ManObjNum(p->pAig) );
    piCopies[0] = 0;
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) ) 
        {
            piCopies[i] = Gia_ManAppendCi( pNew );
            continue;
        }
        if ( Gia_ObjIsCo(pObj) ) 
            continue;
        if ( piCopies[Gia_ObjFaninId0(pObj,i)] == -1 ||
             piCopies[Gia_ObjFaninId1(pObj,i)] == -1 )
             continue;
        iRes0 = Abc_LitNotCond( piCopies[Gia_ObjFaninId0(pObj,i)], Gia_ObjFaninC0(pObj) );
        iRes1 = Abc_LitNotCond( piCopies[Gia_ObjFaninId1(pObj,i)], Gia_ObjFaninC1(pObj) );
        iNode = piCopies[i] = Gia_ManHashAnd( pNew, iRes0, iRes1 );
        pDepths[i] = Abc_MaxInt( pDepths[Gia_ObjFaninId0(pObj,i)], pDepths[Gia_ObjFaninId1(pObj,i)] );
        if ( Gia_ObjRepr(p->pAig, i) == GIA_VOID || Gia_ObjFailed(p->pAig, i) )
            continue;
        assert( Gia_ObjRepr(p->pAig, i) < i );
        iRepr = piCopies[Gia_ObjRepr(p->pAig, i)];
        if ( iRepr == -1 )
            continue;
        if ( Abc_LitRegular(iNode) == Abc_LitRegular(iRepr) )
            continue;
        if ( p->pPars->nLevelMax && 
            (Gia_ObjLevelId(p->pAig, i)  > p->pPars->nLevelMax || 
             Gia_ObjLevelId(p->pAig, Abc_Lit2Var(iRepr)) > p->pPars->nLevelMax) )
            continue;
        if ( p->pPars->fDualOut )
        {
//            if ( i % 1000 == 0 && Gia_ObjRepr(p->pAig, i) )
//                Gia_ManEquivPrintOne( p->pAig, Gia_ObjRepr(p->pAig, i), 0 );
            if ( p->pPars->fColorDiff )
            {
                if ( !Gia_ObjDiffColors( p->pAig, Gia_ObjRepr(p->pAig, i), i ) )
                    continue;
            }
            else
            {
                if ( !Gia_ObjDiffColors2( p->pAig, Gia_ObjRepr(p->pAig, i), i ) )
                    continue;
            }
        }
        pRepr = Gia_ManObj( p->pAig, Gia_ObjRepr(p->pAig, i) );
        fCompl = Gia_ObjPhaseReal(pObj) ^ Gia_ObjPhaseReal(pRepr);
        piCopies[i] = Abc_LitNotCond( iRepr, fCompl );
        if ( Gia_ObjProved(p->pAig, i) )
            continue;
        // produce speculative miter
        iMiter = Gia_ManHashXor( pNew, iNode, piCopies[i] );
        Gia_ManAppendCo( pNew, iMiter );
        Vec_IntPush( p->vXorNodes, Gia_ObjRepr(p->pAig, i) );
        Vec_IntPush( p->vXorNodes, i );
        // add to the depth of this node
        pDepths[i] = 1 + Abc_MaxInt( pDepths[i], pDepths[Gia_ObjRepr(p->pAig, i)] );
        if ( p->pPars->nDepthMax && pDepths[i] >= p->pPars->nDepthMax )
            piCopies[i] = -1;
    }
    ABC_FREE( piCopies );
    ABC_FREE( pDepths );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, 0 );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}